

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O0

result_type __thiscall trng::yarn2::operator()(yarn2 *this)

{
  power<2147483647,_123567893> *in_RDI;
  int32_t in_stack_ffffffffffffffec;
  int32_t iVar1;
  
  step((yarn2 *)in_RDI);
  if (in_RDI->b_power0[2] == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = int_math::power<2147483647,_123567893>::operator()(in_RDI,in_stack_ffffffffffffffec);
  }
  return iVar1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline yarn2::result_type yarn2::operator()() {
    step();
#if defined TRNG_CUDA
    if (S.r[0] == 0)
      return 0;
    yarn2::result_type n = S.r[0];
    int64_t p(1), t(gen);
    while (n > 0) {
      if ((n & 0x1) == 0x1)
        p = int_math::modulo<modulus, 1>(p * t);
      t = int_math::modulo<modulus, 1>(t * t);
      n /= 2;
    }
    return static_cast<yarn2::result_type>(p);
#else
    return S.r[0] == 0 ? 0 : g(S.r[0]);
#endif
  }